

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O1

IntRect * __thiscall
ClipperLib::ClipperBase::GetBounds(IntRect *__return_storage_ptr__,ClipperBase *this)

{
  long lVar1;
  TEdge *pTVar2;
  TEdge *pTVar3;
  LocalMinima *pLVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  TEdge *pTVar9;
  
  pLVar4 = this->m_MinimaList;
  if (pLVar4 == (LocalMinima *)0x0) {
    __return_storage_ptr__->right = 0;
    __return_storage_ptr__->bottom = 0;
    __return_storage_ptr__->left = 0;
    __return_storage_ptr__->top = 0;
    return __return_storage_ptr__;
  }
  pTVar9 = pLVar4->leftBound;
  lVar6 = pTVar9->xbot;
  __return_storage_ptr__->left = lVar6;
  lVar5 = pTVar9->ybot;
  __return_storage_ptr__->top = lVar5;
  __return_storage_ptr__->right = lVar6;
  __return_storage_ptr__->bottom = lVar5;
  lVar7 = lVar5;
  lVar8 = lVar6;
  do {
    pTVar9 = pLVar4->leftBound;
    lVar1 = pTVar9->ybot;
    if (lVar5 < lVar1) {
      __return_storage_ptr__->bottom = lVar1;
      lVar5 = lVar1;
    }
    while( true ) {
      pTVar2 = pTVar9->nextInLML;
      pTVar3 = pTVar9;
      while (pTVar2 != (TEdge *)0x0) {
        lVar1 = pTVar3->xbot;
        if (lVar1 < lVar6) {
          __return_storage_ptr__->left = lVar1;
          lVar6 = lVar1;
        }
        lVar1 = pTVar3->xbot;
        if (lVar8 < lVar1) {
          __return_storage_ptr__->right = lVar1;
          lVar8 = lVar1;
        }
        pTVar3 = pTVar3->nextInLML;
        pTVar2 = pTVar3->nextInLML;
      }
      lVar1 = pTVar3->xbot;
      if (lVar1 < lVar6) {
        __return_storage_ptr__->left = lVar1;
        lVar6 = lVar1;
      }
      lVar1 = pTVar3->xbot;
      if (lVar8 < lVar1) {
        __return_storage_ptr__->right = lVar1;
        lVar8 = lVar1;
      }
      lVar1 = pTVar3->xtop;
      if (lVar1 < lVar6) {
        __return_storage_ptr__->left = lVar1;
        lVar6 = lVar1;
      }
      lVar1 = pTVar3->xtop;
      if (lVar8 < lVar1) {
        __return_storage_ptr__->right = lVar1;
        lVar8 = lVar1;
      }
      lVar1 = pTVar3->ytop;
      if (lVar1 < lVar7) {
        __return_storage_ptr__->top = lVar1;
        lVar7 = lVar1;
      }
      if (pTVar9 != pLVar4->leftBound) break;
      pTVar9 = pLVar4->rightBound;
    }
    pLVar4 = pLVar4->next;
  } while (pLVar4 != (LocalMinima *)0x0);
  return __return_storage_ptr__;
}

Assistant:

IntRect ClipperBase::GetBounds()
{
  IntRect result;
  LocalMinima* lm = m_MinimaList;
  if (!lm)
  {
    result.left = result.top = result.right = result.bottom = 0;
    return result;
  }
  result.left = lm->leftBound->xbot;
  result.top = lm->leftBound->ybot;
  result.right = lm->leftBound->xbot;
  result.bottom = lm->leftBound->ybot;
  while (lm)
  {
    if (lm->leftBound->ybot > result.bottom)
      result.bottom = lm->leftBound->ybot;
    TEdge* e = lm->leftBound;
    for (;;) {
      TEdge* bottomE = e;
      while (e->nextInLML)
      {
        if (e->xbot < result.left) result.left = e->xbot;
        if (e->xbot > result.right) result.right = e->xbot;
        e = e->nextInLML;
      }
      if (e->xbot < result.left) result.left = e->xbot;
      if (e->xbot > result.right) result.right = e->xbot;
      if (e->xtop < result.left) result.left = e->xtop;
      if (e->xtop > result.right) result.right = e->xtop;
      if (e->ytop < result.top) result.top = e->ytop;

      if (bottomE == lm->leftBound) e = lm->rightBound;
      else break;
    }
    lm = lm->next;
  }
  return result;
}